

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O2

void __thiscall Imf_2_5::Attribute::unRegisterAttributeType(Attribute *this,char *typeName)

{
  _Rb_tree_node_base *p_Var1;
  int iVar2;
  uint uVar3;
  _Link_type p_Var4;
  void *pvVar5;
  iterator iVar6;
  long lVar7;
  _Link_type p_Var8;
  _Link_type p_Var9;
  _Link_type p_Var10;
  _Self __tmp;
  _Base_ptr *pp_Var11;
  char *typeName_local;
  Lock local_40;
  
  typeName_local = (char *)this;
  anon_unknown_0::typeMap();
  local_40._mutex = &anon_unknown_0::typeMap::tMap.mutex;
  std::mutex::lock(&anon_unknown_0::typeMap::tMap.mutex);
  local_40._locked = true;
  pp_Var11 = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_parent;
  p_Var10 = (_Link_type)
            &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    p_Var4 = (_Link_type)*pp_Var11;
    iVar6._M_node = &p_Var10->super__Rb_tree_node_base;
    if (p_Var4 == (_Link_type)0x0) goto LAB_001104c0;
    p_Var9 = *(_Link_type *)(p_Var4->_M_storage)._M_storage;
    typeName = (char *)this;
    iVar2 = strcmp((char *)p_Var9,(char *)this);
    lVar7 = 0x18;
    p_Var8 = p_Var10;
    if ((-1 < iVar2) &&
       (iVar2 = strcmp((char *)this,(char *)p_Var9), lVar7 = 0x10, p_Var8 = p_Var4,
       typeName = (char *)p_Var9, -1 < iVar2)) break;
    pp_Var11 = (_Base_ptr *)
               ((long)&(((_Rb_tree_node<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_> *)
                        (&p_Var4->_M_storage + -2))->super__Rb_tree_node_base)._M_color + lVar7);
    p_Var10 = p_Var8;
  }
  p_Var1 = &p_Var4->super__Rb_tree_node_base;
  iVar6 = std::
          _Rb_tree<const_char_*,_std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>,_std::_Select1st<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>,_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
          ::_M_lower_bound((_Rb_tree<const_char_*,_std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>,_std::_Select1st<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>,_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                            *)(p_Var4->super__Rb_tree_node_base)._M_left,p_Var4,
                           (_Base_ptr)&typeName_local,(char **)0x10);
  pp_Var11 = &p_Var1->_M_right;
  while (p_Var9 = (_Link_type)*pp_Var11, typeName = (char *)p_Var4, p_Var9 != (_Link_type)0x0) {
    p_Var4 = *(_Link_type *)(p_Var9->_M_storage)._M_storage;
    uVar3 = strcmp((char *)this,(char *)p_Var4);
    if ((int)uVar3 < 0) {
      p_Var10 = p_Var9;
    }
    pp_Var11 = (_Base_ptr *)((long)(&p_Var9->_M_storage + -1) + (ulong)(~uVar3 >> 0x1f) * 8);
  }
LAB_001104c0:
  if ((anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left == iVar6._M_node) &&
     (p_Var10 ==
      (_Link_type)&anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header))
  {
    std::
    _Rb_tree<const_char_*,_std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>,_std::_Select1st<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>,_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
    ::_M_erase((_Rb_tree<const_char_*,_std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>,_std::_Select1st<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>,_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                *)anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_parent,(_Link_type)typeName);
    anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header
    ;
    anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
                _M_header;
    anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
    ;
  }
  else {
    while ((_Link_type)iVar6._M_node != p_Var10) {
      p_Var4 = (_Link_type)std::_Rb_tree_increment(iVar6._M_node);
      pvVar5 = (void *)std::_Rb_tree_rebalance_for_erase
                                 (iVar6._M_node,
                                  &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.
                                   super__Rb_tree_header._M_header);
      operator_delete(pvVar5,0x30);
      anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
           anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
           _M_node_count - 1;
      iVar6._M_node = (_Base_ptr)p_Var4;
    }
  }
  IlmThread_2_5::Lock::~Lock(&local_40);
  return;
}

Assistant:

void
Attribute::unRegisterAttributeType (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    tMap.erase (typeName);
}